

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O3

int __thiscall spv::Builder::getScalarTypeWidth(Builder *this,Id typeId)

{
  Instruction *pIVar1;
  Id IVar2;
  
  IVar2 = getScalarTypeId(this,typeId);
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[IVar2];
  if (1 < pIVar1->opCode - OpTypeInt) {
    __assert_fail("getTypeClass(scalarTypeId) == OpTypeInt || getTypeClass(scalarTypeId) == OpTypeFloat"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                  ,0x159,"int spv::Builder::getScalarTypeWidth(Id) const");
  }
  if ((**(byte **)&(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data & 1) == 0) {
    return **(int **)&(pIVar1->operands).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data;
  }
  __assert_fail("!idOperand[op]",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
}

Assistant:

int getScalarTypeWidth(Id typeId) const
    {
        Id scalarTypeId = getScalarTypeId(typeId);
        assert(getTypeClass(scalarTypeId) == OpTypeInt || getTypeClass(scalarTypeId) == OpTypeFloat);
        return module.getInstruction(scalarTypeId)->getImmediateOperand(0);
    }